

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O2

bool __thiscall spvtools::opt::DominatorTree::Dominates(DominatorTree *this,uint32_t a,uint32_t b)

{
  DominatorTreeNode *pDVar1;
  DominatorTreeNode *pDVar2;
  
  pDVar1 = GetTreeNode(this,a);
  pDVar2 = GetTreeNode(this,b);
  if (pDVar2 != (DominatorTreeNode *)0x0 && pDVar1 != (DominatorTreeNode *)0x0) {
    if (pDVar1 == pDVar2) {
      return true;
    }
    if (pDVar1->dfs_num_pre_ < pDVar2->dfs_num_pre_) {
      return pDVar2->dfs_num_post_ < pDVar1->dfs_num_post_;
    }
  }
  return false;
}

Assistant:

bool DominatorTree::Dominates(uint32_t a, uint32_t b) const {
  // Check that both of the inputs are actual nodes.
  const DominatorTreeNode* a_node = GetTreeNode(a);
  const DominatorTreeNode* b_node = GetTreeNode(b);
  if (!a_node || !b_node) return false;

  return Dominates(a_node, b_node);
}